

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infozip.cpp
# Opt level: O1

int64_t iz_deflate(int level,char *tgt,char *src,ulg tgtsize,ulg srcsize)

{
  uzoff_t uVar1;
  long lVar2;
  int64_t iVar3;
  int *piVar4;
  IZDeflate *pIVar5;
  int *piVar6;
  undefined1 auStack_4b240 [8];
  IZDeflate zid;
  BufData buf;
  int local_38;
  ush local_34 [2];
  int method;
  ush att;
  ush flags;
  
  local_34[0] = 0xffff;
  local_34[1] = 0;
  local_38 = 8;
  piVar4 = &DAT_00140be0;
  pIVar5 = (IZDeflate *)auStack_4b240;
  for (lVar2 = 0x1d; lVar2 != 0; lVar2 = lVar2 + -1) {
    pIVar5->extra_lbits[0] = *piVar4;
    piVar4 = piVar4 + 1;
    pIVar5 = (IZDeflate *)(pIVar5->extra_lbits + 1);
  }
  piVar4 = &DAT_00140c54;
  piVar6 = zid.extra_lbits + 0x1b;
  for (lVar2 = 0x1e; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar6 = *piVar4;
    piVar4 = piVar4 + 1;
    piVar6 = piVar6 + 1;
  }
  piVar4 = &DAT_00140ccc;
  piVar6 = zid.extra_dbits + 0x1c;
  for (lVar2 = 0x13; lVar2 != 0; lVar2 = lVar2 + -1) {
    *piVar6 = *piVar4;
    piVar4 = piVar4 + 1;
    piVar6 = piVar6 + 1;
  }
  zid.l_desc.static_tree = (ct_data *)0x0;
  zid.bl_tree[0x26].fc = (anon_union_2_2_314cc5cc_for_fc)0x0;
  zid.bl_tree[0x26].dl = (anon_union_2_2_43a7fb4f_for_dl)0x0;
  zid._4276_4_ = 0;
  zid.l_desc.dyn_tree = (ct_data *)0x0;
  zid.l_desc.extra_bits = (int *)0x11e00000101;
  zid.l_desc.extra_base = 0xf;
  zid.l_desc.elems = 0;
  zid.l_desc.max_length = 0;
  zid._4316_8_ = 0;
  zid.d_desc._4_8_ = 0;
  zid.d_desc._12_8_ = 0;
  zid.d_desc._20_8_ = 0xf0000001e;
  zid.d_desc.elems = 0;
  zid.d_desc.max_length = 0;
  zid._4356_8_ = 0;
  zid.bl_desc._4_8_ = 0;
  zid.bl_desc._12_8_ = 0;
  zid.bl_desc._20_8_ = 0x700000013;
  zid.bl_desc.elems = 0;
  zid.bl_count[0xc] = 0x1110;
  zid.bl_count[0xd] = 0x12;
  zid.bl_count[0xe] = 0x708;
  zid.bl_count[0xf] = 0x609;
  builtin_memcpy(zid.bl_order,"\n\x05\v\x04\f\x03\r\x02\x0e\x01\x0f",0xb);
  memcpy(&zid.good_match,&DAT_00140d2c,0x50);
  zid.read_buf = (_func_uint_void_ptr_char_ptr_uint *)0x0;
  zid.dot_size = 0;
  zid.dot_count._0_4_ = 0;
  zid._307604_8_ = 0x100000001;
  zid.verbose = 0;
  zid.noisy = 0;
  zid._307620_8_ = 0;
  zid.key._4_4_ = 0;
  zid._307640_8_ = &zid.read_handle;
  zid._307576_8_ = mem_read;
  zid.head[0x7ffc] = 0;
  zid.head[0x7ffd] = 0;
  zid.head[0x7ffe] = 0;
  zid.head[0x7fff] = 0;
  zid.mesg = (FILE *)(ulong)(uint)level;
  zid.read_handle = src;
  memset(&zid.out_offset,0,0x10000);
  IZDeflate::bi_init((IZDeflate *)auStack_4b240,tgt,(uint)tgtsize,0);
  IZDeflate::ct_init((IZDeflate *)auStack_4b240,local_34,&local_38);
  IZDeflate::lm_init((IZDeflate *)auStack_4b240,(int)zid.mesg + (uint)((int)zid.mesg == 0),
                     local_34 + 1);
  uVar1 = IZDeflate::deflate((IZDeflate *)auStack_4b240);
  if (local_38 == 0) {
    iVar3 = -2;
  }
  else {
    iVar3 = (long)(int)zid.bi_buf + (uVar1 & 0xffffffff) * 8 + -8;
  }
  return iVar3;
}

Assistant:

int64_t iz_deflate(int level, char* tgt, char* src, ulg tgtsize, ulg srcsize)
{
    ush att = (ush)UNKNOWN;
    ush flags = 0;
    unsigned long out_total = 0;
    int method = DEFLATE;

    IZDeflate zid;
    BufData buf;
    buf.in_buf = src;
    buf.in_size = (unsigned)srcsize;
    buf.in_offset = 0;
    buf.zid = &zid;
    buf.fail = false;

    zid.read_buf = mem_read;
    zid.read_handle = &buf;
    zid.window_size = 0L;
    zid.level = level;
    memset(zid.window, 0, sizeof(zid.window));

    zid.bi_init(tgt, (unsigned)(tgtsize), FALSE);
    zid.ct_init(&att, &method);
    zid.lm_init((zid.level != 0 ? zid.level : 1), &flags);
    out_total = (unsigned)zid.deflate();

    if (buf.fail)
        return -1;

    if (method == STORE)
        return -2;

    // printf("Last bits: %d\n", zid.last_bits);
    return ((out_total - 1) << 3) + zid.last_bits;
}